

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall gl4cts::ShaderSubroutine::NegativeTest10::initTestCases(NegativeTest10 *this)

{
  _shader_stage *shader_stage;
  NegativeTest10 *pNVar1;
  int iVar2;
  _shader_stage offending_shader_stage;
  _test_case test_case;
  stringstream name_sstream;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  pointer local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  undefined8 local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  pointer local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_288._8_8_ = &local_1f8;
  local_288._M_allocated_capacity = (size_type)&this->m_test_cases;
  local_2a8._24_8_ = local_1a8 + 0x70;
  iVar2 = 0;
  do {
    local_2a8._20_4_ = iVar2;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_278._M_allocated_capacity = (size_type)&local_268;
    local_278._8_8_ = 0;
    local_268._M_local_buf[0] = NODETYPE_ROOT;
    local_258 = &local_248;
    local_250 = (pointer)0x0;
    local_248._M_local_buf[0] = '\0';
    local_238 = &local_228;
    local_230._0_1_ = false;
    local_230._1_3_ = 0;
    local_230._4_4_ = 0;
    local_228._M_local_buf[0] = '\0';
    local_218 = &local_208;
    local_210 = (pointer)0x0;
    local_208._M_local_buf[0] = '\0';
    local_1f8._8_8_ = 0;
    local_1e8._M_local_buf[0] = '\0';
    local_1d8._M_allocated_capacity = (size_type)&local_1c8;
    local_1d8._8_8_ = 0;
    local_1c8._M_local_buf[0] = '\0';
    local_1f8._M_allocated_capacity = (size_type)&local_1e8;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Broken shader stage:",0x14);
    Utils::getShaderStageString_abi_cxx11_
              ((string *)local_2b8,(Utils *)(local_2a8 + 0x14),shader_stage);
    pNVar1 = (NegativeTest10 *)local_2b8._0_8_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_2b8._0_8_,local_2b8._8_8_);
    if ((NegativeTest10 *)local_2b8._0_8_ != (NegativeTest10 *)local_2a8) {
      pNVar1 = (NegativeTest10 *)(local_2a8._0_8_ + 1);
      operator_delete((void *)local_2b8._0_8_,(ulong)pNVar1);
    }
    getFragmentShader_abi_cxx11_((string *)local_2b8,pNVar1,iVar2 == 4);
    pNVar1 = (NegativeTest10 *)local_2b8;
    std::__cxx11::string::operator=((string *)&local_258,(string *)local_2b8);
    if ((NegativeTest10 *)local_2b8._0_8_ != (NegativeTest10 *)local_2a8) {
      pNVar1 = (NegativeTest10 *)(local_2a8._0_8_ + 1);
      operator_delete((void *)local_2b8._0_8_,(ulong)pNVar1);
    }
    getGeometryShader_abi_cxx11_((string *)local_2b8,pNVar1,iVar2 == 3);
    std::__cxx11::string::operator=((string *)&local_238,(string *)local_2b8);
    if ((NegativeTest10 *)local_2b8._0_8_ != (NegativeTest10 *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_,local_2a8._0_8_ + 1);
    }
    std::__cxx11::stringbuf::str();
    pNVar1 = (NegativeTest10 *)local_2b8;
    std::__cxx11::string::operator=((string *)local_278._M_local_buf,(string *)local_2b8);
    if ((NegativeTest10 *)local_2b8._0_8_ != (NegativeTest10 *)local_2a8) {
      pNVar1 = (NegativeTest10 *)(local_2a8._0_8_ + 1);
      operator_delete((void *)local_2b8._0_8_,(ulong)pNVar1);
    }
    getTessellationControlShader_abi_cxx11_((string *)local_2b8,pNVar1,iVar2 == 1);
    pNVar1 = (NegativeTest10 *)local_2b8;
    std::__cxx11::string::operator=((string *)&local_218,(string *)local_2b8);
    if ((NegativeTest10 *)local_2b8._0_8_ != (NegativeTest10 *)local_2a8) {
      pNVar1 = (NegativeTest10 *)(local_2a8._0_8_ + 1);
      operator_delete((void *)local_2b8._0_8_,(ulong)pNVar1);
    }
    getTessellationEvaluationShader_abi_cxx11_((string *)local_2b8,pNVar1,iVar2 == 2);
    pNVar1 = (NegativeTest10 *)local_2b8;
    std::__cxx11::string::operator=((string *)local_288._8_8_,(string *)local_2b8);
    if ((NegativeTest10 *)local_2b8._0_8_ != (NegativeTest10 *)local_2a8) {
      pNVar1 = (NegativeTest10 *)(local_2a8._0_8_ + 1);
      operator_delete((void *)local_2b8._0_8_,(ulong)pNVar1);
    }
    getVertexShader_abi_cxx11_((string *)local_2b8,pNVar1,iVar2 == 0);
    std::__cxx11::string::operator=((string *)local_1d8._M_local_buf,(string *)local_2b8);
    if ((NegativeTest10 *)local_2b8._0_8_ != (NegativeTest10 *)local_2a8) {
      operator_delete((void *)local_2b8._0_8_,local_2a8._0_8_ + 1);
    }
    std::
    vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>
    ::push_back((vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>
                 *)local_288._M_allocated_capacity,(value_type *)&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_allocated_capacity != &local_1c8) {
      operator_delete((void *)local_1d8._M_allocated_capacity,
                      CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_allocated_capacity != &local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) + 1)
      ;
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,
                      CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]) + 1)
      ;
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,
                      CONCAT71(local_228._M_allocated_capacity._1_7_,local_228._M_local_buf[0]) + 1)
      ;
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,
                      CONCAT71(local_248._M_allocated_capacity._1_7_,local_248._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_allocated_capacity != &local_268) {
      operator_delete((void *)local_278._M_allocated_capacity,
                      CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) + 1)
      ;
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)local_2a8._24_8_);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 5);
  return;
}

Assistant:

void NegativeTest10::initTestCases()
{
	/* For each test case, only one shader stage should define a function that
	 * has already been defined as a subroutine. */
	for (int offending_shader_stage_it = static_cast<int>(Utils::SHADER_STAGE_FIRST);
		 offending_shader_stage_it != static_cast<int>(Utils::SHADER_STAGE_COUNT); ++offending_shader_stage_it)
	{
		Utils::_shader_stage offending_shader_stage = static_cast<Utils::_shader_stage>(offending_shader_stage_it);
		/* Form the test case descriptor */
		std::stringstream name_sstream;
		_test_case		  test_case;

		name_sstream << "Broken shader stage:" << Utils::getShaderStageString(offending_shader_stage);

		test_case.fs_body = getFragmentShader(offending_shader_stage == Utils::SHADER_STAGE_FRAGMENT);
		test_case.gs_body = getGeometryShader(offending_shader_stage == Utils::SHADER_STAGE_GEOMETRY);
		test_case.name	= name_sstream.str();
		test_case.tc_body =
			getTessellationControlShader(offending_shader_stage == Utils::SHADER_STAGE_TESSELLATION_CONTROL);
		test_case.te_body =
			getTessellationEvaluationShader(offending_shader_stage == Utils::SHADER_STAGE_TESSELLATION_EVALUATION);
		test_case.vs_body = getVertexShader(offending_shader_stage == Utils::SHADER_STAGE_VERTEX);

		m_test_cases.push_back(test_case);
	}
}